

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_map_clear(wally_map *map_in)

{
  ulong local_20;
  size_t i;
  wally_map *map_in_local;
  
  if (map_in == (wally_map *)0x0) {
    map_in_local._4_4_ = -2;
  }
  else {
    for (local_20 = 0; local_20 < map_in->num_items; local_20 = local_20 + 1) {
      clear_and_free(map_in->items[local_20].key,map_in->items[local_20].key_len);
      clear_and_free(map_in->items[local_20].value,map_in->items[local_20].value_len);
    }
    clear_and_free(map_in->items,map_in->num_items << 5);
    wally_clear(map_in,0x18);
    map_in_local._4_4_ = 0;
  }
  return map_in_local._4_4_;
}

Assistant:

int wally_map_clear(struct wally_map *map_in)
{
    size_t i;

    if (!map_in)
        return WALLY_EINVAL;
    for (i = 0; i < map_in->num_items; ++i) {
        clear_and_free(map_in->items[i].key, map_in->items[i].key_len);
        clear_and_free(map_in->items[i].value, map_in->items[i].value_len);
    }
    clear_and_free(map_in->items, map_in->num_items * sizeof(*map_in->items));
    wally_clear(map_in, sizeof(*map_in));
    return WALLY_OK;
}